

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name)

{
  Catch local_38 [32];
  string *local_18;
  string *name_local;
  NamePattern *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  Pattern::Pattern(&this->super_Pattern);
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_0022cca8;
  toLower(local_38,local_18);
  WildcardPattern::WildcardPattern(&this->m_wildcardPattern,(string *)local_38,No);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

NamePattern(std::string const& name)
				: m_wildcardPattern(toLower(name), CaseSensitive::No)
			{}